

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O0

string * tid_to_string_abi_cxx11_(string *__return_storage_ptr__,id *tid)

{
  basic_ostream<char,_std::char_traits<char>_> *this;
  ostringstream local_190 [8];
  ostringstream oss;
  id *tid_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,
                         (id)tid->_M_thread);
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string tid_to_string(const thread::id& tid)
{
    ostringstream oss;
    oss << tid << endl;
    return oss.str();
}